

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
dynet::Tanh::forward_impl
          (Tanh *this,vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,
          Tensor *fx)

{
  long in_RDX;
  Device_CPU *in_stack_00000028;
  Tanh *in_stack_00000030;
  
  if (*(long *)(in_RDX + 0x48) == 0) {
    __assert_fail("fx.device",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0x7df,
                  "virtual void dynet::Tanh::forward_impl(const std::vector<const Tensor *> &, Tensor &) const"
                 );
  }
  if (*(int *)(*(long *)(in_RDX + 0x48) + 0xc) == 0) {
    forward_dev_impl<dynet::Device_CPU>
              (in_stack_00000030,in_stack_00000028,
               (vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *)this,
               (Tensor *)xs);
    return;
  }
  abort();
}

Assistant:

void Transpose::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if (dim.rows() == 1 || dim.cols() == 1) {
    fx.v = xs[0]->v;
  } else {
#if __CUDACC__
    for(unsigned b = 0; b < xs[0]->d.bd; ++b)
      CUBLAS_CHECK(cublasSgeam(dev.cublas_handle, CUBLAS_OP_T, CUBLAS_OP_N, fx.d.rows(), fx.d.cols(),
                               kSCALAR_ONE, xs[0]->batch_ptr(b), xs[0]->d.rows(), kSCALAR_ZERO, NULL, fx.d.rows(), fx.batch_ptr(b), fx.d.rows()));
#else
    for(unsigned b = 0; b < xs[0]->d.bd; ++b)
      fx.batch_matrix(b).noalias() = xs[0]->batch_matrix(b).transpose();
#endif
  }
}